

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowMetricsWindow(bool *p_open)

{
  ImVector<ImGuiWindow_*> *windows;
  ImVector<unsigned_int> *pIVar1;
  ImGuiTabBar *tab_bar;
  ImGuiPopupRef *pIVar2;
  undefined8 *puVar3;
  ImGuiTabBar *pIVar4;
  ImGuiWindow *pIVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  char *pcVar8;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar9;
  undefined8 uVar10;
  int i;
  long lVar11;
  int tab_n;
  ulong uVar12;
  char *pcVar13;
  int n;
  int i_1;
  long lVar14;
  ImGuiTabItem *tab;
  ImDrawList *this;
  float fVar15;
  ImVec2 local_140;
  char buf [32];
  
  bVar7 = Begin("ImGui Metrics",p_open,0);
  pIVar6 = GImGui;
  if (bVar7) {
    Text("Dear ImGui %s","1.68 WIP");
    fVar15 = (pIVar6->IO).Framerate;
    Text("Application average %.3f ms/frame (%.1f FPS)",(double)(1000.0 / fVar15),
         SUB84((double)fVar15,0));
    Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)(pIVar6->IO).MetricsRenderVertices,
         (ulong)(uint)(pIVar6->IO).MetricsRenderIndices);
    Text("%d active windows (%d visible)",(ulong)(uint)(pIVar6->IO).MetricsActiveWindows,
         (ulong)(uint)(pIVar6->IO).MetricsRenderWindows);
    Text("%d allocations",(ulong)(uint)(pIVar6->IO).MetricsActiveAllocations);
    Checkbox("Show clipping rectangles when hovering draw commands",
             &ShowMetricsWindow::show_draw_cmd_clip_rects);
    Checkbox("Ctrl shows window begin order",&ShowMetricsWindow::show_window_begin_order);
    Separator();
    pIVar6 = GImGui;
    windows = &GImGui->Windows;
    ShowMetricsWindow::Funcs::NodeWindows(windows,"Windows");
    bVar7 = TreeNode("DrawList","Active DrawLists (%d)",
                     (ulong)(uint)(pIVar6->DrawDataBuilder).Layers[0].Size);
    if (bVar7) {
      pcVar9 = extraout_RDX;
      for (lVar11 = 0; lVar11 < (pIVar6->DrawDataBuilder).Layers[0].Size; lVar11 = lVar11 + 1) {
        ShowMetricsWindow::Funcs::NodeDrawList
                  ((ImGuiWindow *)0x0,(pIVar6->DrawDataBuilder).Layers[0].Data[lVar11],pcVar9);
        pcVar9 = extraout_RDX_00;
      }
      TreePop();
    }
    bVar7 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(pIVar6->OpenPopupStack).Size);
    if (bVar7) {
      lVar11 = 8;
      for (lVar14 = 0; lVar14 < (pIVar6->OpenPopupStack).Size; lVar14 = lVar14 + 1) {
        pIVar2 = (pIVar6->OpenPopupStack).Data;
        puVar3 = *(undefined8 **)((long)&pIVar2->PopupId + lVar11);
        pcVar8 = "";
        pcVar9 = "NULL";
        pcVar13 = "";
        if (puVar3 != (undefined8 *)0x0) {
          pcVar9 = (char *)*puVar3;
          pcVar8 = " ChildWindow";
          if ((*(uint *)((long)puVar3 + 0xc) >> 0x18 & 1) == 0) {
            pcVar8 = "";
          }
          pcVar13 = " ChildMenu";
          if ((*(uint *)((long)puVar3 + 0xc) >> 0x1c & 1) == 0) {
            pcVar13 = "";
          }
        }
        BulletText("PopupID: %08x, Window: \'%s\'%s%s",(ulong)*(uint *)((long)pIVar2 + lVar11 + -8),
                   pcVar9,pcVar8,pcVar13);
        lVar11 = lVar11 + 0x30;
      }
      TreePop();
    }
    bVar7 = TreeNode("TabBars","Tab Bars (%d)",(ulong)(uint)(pIVar6->TabBars).Data.Size);
    if (bVar7) {
      for (lVar11 = 0; lVar11 < (pIVar6->TabBars).Data.Size; lVar11 = lVar11 + 1) {
        pIVar4 = (pIVar6->TabBars).Data.Data;
        tab_bar = pIVar4 + lVar11;
        pcVar9 = "";
        if (pIVar4[lVar11].PrevFrameVisible < GImGui->FrameCount + -2) {
          pcVar9 = " *Inactive*";
        }
        ImFormatString(buf,0x100,"TabBar (%d tabs)%s",(ulong)(uint)pIVar4[lVar11].Tabs.Size,pcVar9);
        bVar7 = TreeNode(tab_bar,"%s",buf);
        if (bVar7) {
          lVar14 = 0;
          for (uVar12 = 0; (long)uVar12 < (long)(tab_bar->Tabs).Size; uVar12 = uVar12 + 1) {
            tab = (ImGuiTabItem *)((long)&((tab_bar->Tabs).Data)->ID + lVar14);
            PushID(tab);
            bVar7 = SmallButton("<");
            if (bVar7) {
              TabBarQueueChangeTabOrder(tab_bar,tab,-1);
            }
            SameLine(0.0,2.0);
            bVar7 = SmallButton(">");
            if (bVar7) {
              TabBarQueueChangeTabOrder(tab_bar,tab,1);
            }
            SameLine(0.0,-1.0);
            uVar10 = 0x2a;
            if (tab->ID != tab_bar->SelectedTabId) {
              uVar10 = 0x20;
            }
            Text("%02d%c Tab 0x%08X",uVar12 & 0xffffffff,uVar10);
            pIVar1 = &GImGui->CurrentWindow->IDStack;
            pIVar1->Size = pIVar1->Size + -1;
            lVar14 = lVar14 + 0x1c;
          }
          TreePop();
        }
      }
      TreePop();
    }
    bVar7 = TreeNode("Internal state");
    if (bVar7) {
      pcVar8 = "NULL";
      pcVar9 = "NULL";
      if (pIVar6->HoveredWindow != (ImGuiWindow *)0x0) {
        pcVar9 = pIVar6->HoveredWindow->Name;
      }
      Text("HoveredWindow: \'%s\'",pcVar9);
      pcVar9 = "NULL";
      if (pIVar6->HoveredRootWindow != (ImGuiWindow *)0x0) {
        pcVar9 = pIVar6->HoveredRootWindow->Name;
      }
      Text("HoveredRootWindow: \'%s\'",pcVar9);
      Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d",(double)pIVar6->HoveredIdTimer,
           (ulong)pIVar6->HoveredId,(ulong)pIVar6->HoveredIdPreviousFrame,
           (ulong)pIVar6->HoveredIdAllowOverlap);
      Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
           (double)pIVar6->ActiveIdTimer,(ulong)pIVar6->ActiveId,
           (ulong)pIVar6->ActiveIdPreviousFrame,(ulong)pIVar6->ActiveIdAllowOverlap,
           (&PTR_anon_var_dwarf_4c7bc_001df890)[pIVar6->ActiveIdSource]);
      pcVar9 = "NULL";
      if (pIVar6->ActiveIdWindow != (ImGuiWindow *)0x0) {
        pcVar9 = pIVar6->ActiveIdWindow->Name;
      }
      Text("ActiveIdWindow: \'%s\'",pcVar9);
      pcVar9 = "NULL";
      if (pIVar6->MovingWindow != (ImGuiWindow *)0x0) {
        pcVar9 = pIVar6->MovingWindow->Name;
      }
      Text("MovingWindow: \'%s\'",pcVar9);
      pcVar9 = "NULL";
      if (pIVar6->NavWindow != (ImGuiWindow *)0x0) {
        pcVar9 = pIVar6->NavWindow->Name;
      }
      Text("NavWindow: \'%s\'",pcVar9);
      Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar6->NavId,(ulong)pIVar6->NavLayer);
      Text("NavInputSource: %s",(&PTR_anon_var_dwarf_4c7bc_001df890)[pIVar6->NavInputSource]);
      Text("NavActive: %d, NavVisible: %d",(ulong)(pIVar6->IO).NavActive,
           (ulong)(pIVar6->IO).NavVisible);
      Text("NavActivateId: 0x%08X, NavInputId: 0x%08X",(ulong)pIVar6->NavActivateId,
           (ulong)pIVar6->NavInputId);
      Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",(ulong)pIVar6->NavDisableHighlight,
           (ulong)pIVar6->NavDisableMouseHover);
      if (pIVar6->NavWindowingTarget != (ImGuiWindow *)0x0) {
        pcVar8 = pIVar6->NavWindowingTarget->Name;
      }
      Text("NavWindowingTarget: \'%s\'",pcVar8);
      Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",
           (ulong)pIVar6->DragDropActive,(ulong)(pIVar6->DragDropPayload).SourceId,
           (pIVar6->DragDropPayload).DataType,(ulong)(uint)(pIVar6->DragDropPayload).DataSize);
      TreePop();
    }
    if (((pIVar6->IO).KeyCtrl == true) && (ShowMetricsWindow::show_window_begin_order == true)) {
      for (lVar11 = 0; lVar11 < windows->Size; lVar11 = lVar11 + 1) {
        pIVar5 = (pIVar6->Windows).Data[lVar11];
        if (((pIVar5->Flags & 0x1000000) == 0) && (pIVar5->WasActive == true)) {
          ImFormatString(buf,0x20,"%d",(ulong)(uint)(int)pIVar5->BeginOrderWithinContext);
          fVar15 = GImGui->FontSize + GImGui->FontSize;
          this = &GImGui->OverlayDrawList;
          local_140.y = fVar15 + (pIVar5->Pos).y;
          local_140.x = fVar15 + (pIVar5->Pos).x;
          ImDrawList::AddRectFilled(this,&pIVar5->Pos,&local_140,0xff6464c8,0.0,0xf);
          ImDrawList::AddText(this,(ImFont *)0x0,fVar15,&pIVar5->Pos,0xffffffff,buf,(char *)0x0,0.0,
                              (ImVec4 *)0x0);
        }
      }
    }
    End();
    return;
  }
  End();
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    if (!ImGui::Begin("ImGui Metrics", p_open))
    {
        ImGui::End();
        return;
    }

    static bool show_draw_cmd_clip_rects = true;
    static bool show_window_begin_order = false;
    ImGuiIO& io = ImGui::GetIO();
    ImGui::Text("Dear ImGui %s", ImGui::GetVersion());
    ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    ImGui::Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    ImGui::Text("%d active windows (%d visible)", io.MetricsActiveWindows, io.MetricsRenderWindows);
    ImGui::Text("%d allocations", io.MetricsActiveAllocations);
    ImGui::Checkbox("Show clipping rectangles when hovering draw commands", &show_draw_cmd_clip_rects);
    ImGui::Checkbox("Ctrl shows window begin order", &show_window_begin_order);
    ImGui::Separator();

    struct Funcs
    {
        static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImColor(255,100,100), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* overlay_draw_list = GetOverlayDrawList(window); // Render additional visuals into the top-most draw list
            if (window && IsItemHovered())
                overlay_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }
                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "Draw %4d %s vtx, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)", pcmd->ElemCount, draw_list->IdxBuffer.Size > 0 ? "indexed" : "non-indexed", pcmd->TextureId, pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                if (show_draw_cmd_clip_rects && ImGui::IsItemHovered())
                {
                    ImRect clip_rect = pcmd->ClipRect;
                    ImRect vtxs_rect;
                    for (int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                        vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                    clip_rect.Floor(); overlay_draw_list->AddRect(clip_rect.Min, clip_rect.Max, IM_COL32(255,255,0,255));
                    vtxs_rect.Floor(); overlay_draw_list->AddRect(vtxs_rect.Min, vtxs_rect.Max, IM_COL32(255,0,255,255));
                }
                if (!pcmd_node_open)
                    continue;

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, vtx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                    {
                        char buf[300];
                        char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangles_pos[3];
                        for (int n = 0; n < 3; n++, vtx_i++)
                        {
                            ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[vtx_i] : vtx_i];
                            triangles_pos[n] = v.pos;
                            buf_p += ImFormatString(buf_p, (int)(buf_end - buf_p), "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n", (n == 0) ? "vtx" : "   ", vtx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }
                        ImGui::Selectable(buf, false);
                        if (ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = overlay_draw_list->Flags;
                            overlay_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines at is more readable for very large and thin triangles.
                            overlay_draw_list->AddPolyline(triangles_pos, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            overlay_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }

        static void NodeWindows(ImVector<ImGuiWindow*>& windows, const char* label)
        {
            if (!ImGui::TreeNode(label, "%s (%d)", label, windows.Size))
                return;
            for (int i = 0; i < windows.Size; i++)
                Funcs::NodeWindow(windows[i], "Window");
            ImGui::TreePop();
        }

        static void NodeWindow(ImGuiWindow* window, const char* label)
        {
            if (!ImGui::TreeNode(window, "%s '%s', %d @ 0x%p", label, window->Name, window->Active || window->WasActive, window))
                return;
            ImGuiWindowFlags flags = window->Flags;
            NodeDrawList(window, window->DrawList, "DrawList");
            ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), SizeContents (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->SizeContents.x, window->SizeContents.y);
            ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
                (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
                (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
            ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f)", window->Scroll.x, GetWindowScrollMaxX(window), window->Scroll.y, GetWindowScrollMaxY(window));
            ImGui::BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
            ImGui::BulletText("Appearing: %d, Hidden: %d (Reg %d Resize %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesRegular, window->HiddenFramesForResize, window->SkipItems);
            ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
            ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
            if (!window->NavRectRel[0].IsInverted())
                ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
            else
                ImGui::BulletText("NavRectRel[0]: <None>");
            if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
            if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
            if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
            if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
            {
                for (int n = 0; n < window->ColumnsStorage.Size; n++)
                {
                    const ImGuiColumnsSet* columns = &window->ColumnsStorage[n];
                    if (ImGui::TreeNode((void*)(uintptr_t)columns->ID, "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X", columns->ID, columns->Count, columns->Flags))
                    {
                        ImGui::BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)", columns->MaxX - columns->MinX, columns->MinX, columns->MaxX);
                        for (int column_n = 0; column_n < columns->Columns.Size; column_n++)
                            ImGui::BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)", column_n, columns->Columns[column_n].OffsetNorm, OffsetNormToPixels(columns, columns->Columns[column_n].OffsetNorm));
                        ImGui::TreePop();
                    }
                }
                ImGui::TreePop();
            }
            ImGui::BulletText("Storage: %d bytes", window->StateStorage.Data.Size * (int)sizeof(ImGuiStorage::Pair));
            ImGui::TreePop();
        }

        static void NodeTabBar(ImGuiTabBar* tab_bar)
        {
            // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernable strings.
            char buf[256];
            char* p = buf;
            const char* buf_end = buf + IM_ARRAYSIZE(buf);
            p += ImFormatString(p, buf_end - p, "TabBar (%d tabs)%s",
                tab_bar->Tabs.Size, (tab_bar->PrevFrameVisible < ImGui::GetFrameCount() - 2) ? " *Inactive*" : "");
            if (ImGui::TreeNode(tab_bar, "%s", buf))
            {
                for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
                {
                    const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
                    ImGui::PushID(tab);
                    if (ImGui::SmallButton("<")) { TabBarQueueChangeTabOrder(tab_bar, tab, -1); } ImGui::SameLine(0, 2);
                    if (ImGui::SmallButton(">")) { TabBarQueueChangeTabOrder(tab_bar, tab, +1); } ImGui::SameLine();
                    ImGui::Text("%02d%c Tab 0x%08X", tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID);
                    ImGui::PopID();
                }
                ImGui::TreePop();
            }
        }
    };

    // Access private state, we are going to display the draw lists from last frame
    ImGuiContext& g = *GImGui;
    Funcs::NodeWindows(g.Windows, "Windows");
    if (ImGui::TreeNode("DrawList", "Active DrawLists (%d)", g.DrawDataBuilder.Layers[0].Size))
    {
        for (int i = 0; i < g.DrawDataBuilder.Layers[0].Size; i++)
            Funcs::NodeDrawList(NULL, g.DrawDataBuilder.Layers[0][i], "DrawList");
        ImGui::TreePop();
    }
    if (ImGui::TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            ImGui::BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        ImGui::TreePop();
    }
    if (ImGui::TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.Data.Size))
    {
        for (int n = 0; n < g.TabBars.Data.Size; n++)
            Funcs::NodeTabBar(g.TabBars.GetByIndex(n));
        ImGui::TreePop();
    }
    if (ImGui::TreeNode("Internal state"))
    {
        const char* input_source_names[] = { "None", "Mouse", "Nav", "NavKeyboard", "NavGamepad" }; IM_ASSERT(IM_ARRAYSIZE(input_source_names) == ImGuiInputSource_COUNT);
        ImGui::Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        ImGui::Text("HoveredRootWindow: '%s'", g.HoveredRootWindow ? g.HoveredRootWindow->Name : "NULL");
        ImGui::Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredId, g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Data is "in-flight" so depending on when the Metrics window is called we may see current frame information or not
        ImGui::Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, input_source_names[g.ActiveIdSource]);
        ImGui::Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");
        ImGui::Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        ImGui::Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        ImGui::Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        ImGui::Text("NavInputSource: %s", input_source_names[g.NavInputSource]);
        ImGui::Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        ImGui::Text("NavActivateId: 0x%08X, NavInputId: 0x%08X", g.NavActivateId, g.NavInputId);
        ImGui::Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        ImGui::Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        ImGui::Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        ImGui::TreePop();
    }


    if (g.IO.KeyCtrl && show_window_begin_order)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if ((window->Flags & ImGuiWindowFlags_ChildWindow) || !window->WasActive)
                continue;
            char buf[32];
            ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
            float font_size = ImGui::GetFontSize() * 2;
            ImDrawList* overlay_draw_list = GetOverlayDrawList(window);
            overlay_draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
            overlay_draw_list->AddText(NULL, font_size, window->Pos, IM_COL32(255, 255, 255, 255), buf);
        }
    }
    ImGui::End();
}